

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_bandpre.c
# Opt level: O2

int ARKBandPrecInit(void *arkode_mem,sunindextype N,sunindextype mu,sunindextype ml)

{
  N_Vector *v;
  int iVar1;
  sunindextype *__ptr;
  SUNMatrix p_Var2;
  SUNMatrix A;
  SUNLinearSolver p_Var3;
  int line;
  long ml_00;
  long smu;
  ARKodeMem ark_mem_00;
  char *msgfmt;
  ARKodeMem ark_mem;
  ARKLsMem arkls_mem;
  void *local_38;
  
  iVar1 = arkLs_AccessARKODELMem(arkode_mem,"ARKBandPrecInit",&ark_mem,&arkls_mem);
  ark_mem_00 = ark_mem;
  if (iVar1 != 0) {
    return iVar1;
  }
  if (ark_mem->tempv1->ops->nvgetarraypointer == (_func_sunrealtype_ptr_N_Vector *)0x0) {
    msgfmt = "A required vector operation is not implemented.";
    iVar1 = -3;
    line = 0x48;
  }
  else {
    __ptr = (sunindextype *)malloc(0x50);
    if (__ptr == (sunindextype *)0x0) {
      msgfmt = "A memory request failed.";
      iVar1 = -4;
      line = 0x52;
    }
    else {
      __ptr[9] = (sunindextype)arkode_mem;
      *__ptr = N;
      if (mu < 1) {
        mu = 0;
      }
      smu = N + -1;
      if (N <= mu) {
        mu = smu;
      }
      __ptr[2] = mu;
      ml_00 = 0;
      if (0 < ml) {
        ml_00 = ml;
      }
      if (N <= ml_00) {
        ml_00 = smu;
      }
      __ptr[1] = ml_00;
      __ptr[8] = 0;
      local_38 = arkode_mem;
      p_Var2 = SUNBandMatrixStorage(N,mu,ml_00,mu,ark_mem_00->sunctx);
      __ptr[3] = (sunindextype)p_Var2;
      if (p_Var2 == (SUNMatrix)0x0) {
        free(__ptr);
        line = 0x67;
        ark_mem_00 = ark_mem;
      }
      else {
        if (ml_00 + mu < N) {
          smu = ml_00 + mu;
        }
        A = SUNBandMatrixStorage(N,mu,ml_00,smu,ark_mem->sunctx);
        __ptr[4] = (sunindextype)A;
        if (A != (SUNMatrix)0x0) {
          p_Var3 = SUNLinSol_Band(ark_mem->tempv1,A,ark_mem->sunctx);
          __ptr[5] = (sunindextype)p_Var3;
          if (p_Var3 == (SUNLinearSolver)0x0) {
            SUNMatDestroy(A);
            SUNMatDestroy(p_Var2);
            free(__ptr);
            msgfmt = "A memory request failed.";
            iVar1 = -4;
            line = 0x83;
            ark_mem_00 = ark_mem;
          }
          else {
            __ptr[6] = 0;
            v = (N_Vector *)(__ptr + 6);
            iVar1 = arkAllocVec(ark_mem,ark_mem->tempv1,v);
            if (iVar1 == 0) {
              SUNLinSolFree(__ptr[5]);
              SUNMatDestroy(__ptr[4]);
              SUNMatDestroy(__ptr[3]);
              free(__ptr);
              msgfmt = "A memory request failed.";
              iVar1 = -4;
              line = 0x91;
              ark_mem_00 = ark_mem;
            }
            else {
              __ptr[7] = 0;
              iVar1 = arkAllocVec(ark_mem,ark_mem->tempv1,(N_Vector *)(__ptr + 7));
              if (iVar1 == 0) {
                SUNLinSolFree(__ptr[5]);
                SUNMatDestroy(__ptr[4]);
                SUNMatDestroy(__ptr[3]);
                arkFreeVec(ark_mem,v);
                free(__ptr);
                msgfmt = "A memory request failed.";
                iVar1 = -4;
                line = 0x9f;
                ark_mem_00 = ark_mem;
              }
              else {
                iVar1 = SUNLinSolInitialize();
                if (iVar1 == 0) {
                  if (arkls_mem->pfree != (_func_int_ARKodeMem *)0x0) {
                    (*arkls_mem->pfree)(ark_mem);
                  }
                  arkls_mem->P_data = __ptr;
                  arkls_mem->pfree = ARKBandPrecFree;
                  iVar1 = ARKodeSetPreconditioner(local_38,ARKBandPrecSetup,ARKBandPrecSolve);
                  return iVar1;
                }
                SUNLinSolFree(__ptr[5]);
                SUNMatDestroy(__ptr[4]);
                SUNMatDestroy(__ptr[3]);
                arkFreeVec(ark_mem,v);
                arkFreeVec(ark_mem,(N_Vector *)(__ptr + 7));
                free(__ptr);
                msgfmt = "An error arose from a SUNBandLinearSolver routine.";
                iVar1 = -0xc;
                line = 0xaf;
                ark_mem_00 = ark_mem;
              }
            }
          }
          goto LAB_00121584;
        }
        SUNMatDestroy(p_Var2);
        free(__ptr);
        line = 0x75;
        ark_mem_00 = ark_mem;
      }
      iVar1 = -4;
      msgfmt = "A memory request failed.";
    }
  }
LAB_00121584:
  arkProcessError(ark_mem_00,iVar1,line,"ARKBandPrecInit",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_bandpre.c"
                  ,msgfmt);
  return iVar1;
}

Assistant:

int ARKBandPrecInit(void* arkode_mem, sunindextype N, sunindextype mu,
                    sunindextype ml)
{
  ARKodeMem ark_mem;
  ARKLsMem arkls_mem;
  ARKBandPrecData pdata;
  sunindextype mup, mlp, storagemu;
  int retval;

  /* access ARKodeMem and ARKLsMem structures */
  retval = arkLs_AccessARKODELMem(arkode_mem, __func__, &ark_mem, &arkls_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  /* Test compatibility of NVECTOR package with the BAND preconditioner */
  if (ark_mem->tempv1->ops->nvgetarraypointer == NULL)
  {
    arkProcessError(ark_mem, ARKLS_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_BP_BAD_NVECTOR);
    return (ARKLS_ILL_INPUT);
  }

  /* Allocate data memory */
  pdata = NULL;
  pdata = (ARKBandPrecData)malloc(sizeof *pdata);
  if (pdata == NULL)
  {
    arkProcessError(ark_mem, ARKLS_MEM_FAIL, __LINE__, __func__, __FILE__,
                    MSG_BP_MEM_FAIL);
    return (ARKLS_MEM_FAIL);
  }

  /* Load pointers and bandwidths into pdata block. */
  pdata->arkode_mem = arkode_mem;
  pdata->N          = N;
  pdata->mu = mup = SUNMIN(N - 1, SUNMAX(0, mu));
  pdata->ml = mlp = SUNMIN(N - 1, SUNMAX(0, ml));

  /* Initialize nfeBP counter */
  pdata->nfeBP = 0;

  /* Allocate memory for saved banded Jacobian approximation. */
  pdata->savedJ = NULL;
  pdata->savedJ = SUNBandMatrixStorage(N, mup, mlp, mup, ark_mem->sunctx);
  if (pdata->savedJ == NULL)
  {
    free(pdata);
    pdata = NULL;
    arkProcessError(ark_mem, ARKLS_MEM_FAIL, __LINE__, __func__, __FILE__,
                    MSG_BP_MEM_FAIL);
    return (ARKLS_MEM_FAIL);
  }

  /* Allocate memory for banded preconditioner. */
  storagemu     = SUNMIN(N - 1, mup + mlp);
  pdata->savedP = NULL;
  pdata->savedP = SUNBandMatrixStorage(N, mup, mlp, storagemu, ark_mem->sunctx);
  if (pdata->savedP == NULL)
  {
    SUNMatDestroy(pdata->savedJ);
    free(pdata);
    pdata = NULL;
    arkProcessError(ark_mem, ARKLS_MEM_FAIL, __LINE__, __func__, __FILE__,
                    MSG_BP_MEM_FAIL);
    return (ARKLS_MEM_FAIL);
  }

  /* Allocate memory for banded linear solver */
  pdata->LS = NULL;
  pdata->LS = SUNLinSol_Band(ark_mem->tempv1, pdata->savedP, ark_mem->sunctx);
  if (pdata->LS == NULL)
  {
    SUNMatDestroy(pdata->savedP);
    SUNMatDestroy(pdata->savedJ);
    free(pdata);
    pdata = NULL;
    arkProcessError(ark_mem, ARKLS_MEM_FAIL, __LINE__, __func__, __FILE__,
                    MSG_BP_MEM_FAIL);
    return (ARKLS_MEM_FAIL);
  }

  /* allocate memory for temporary N_Vectors */
  pdata->tmp1 = NULL;
  if (!arkAllocVec(ark_mem, ark_mem->tempv1, &(pdata->tmp1)))
  {
    SUNLinSolFree(pdata->LS);
    SUNMatDestroy(pdata->savedP);
    SUNMatDestroy(pdata->savedJ);
    free(pdata);
    pdata = NULL;
    arkProcessError(ark_mem, ARKLS_MEM_FAIL, __LINE__, __func__, __FILE__,
                    MSG_BP_MEM_FAIL);
    return (ARKLS_MEM_FAIL);
  }

  pdata->tmp2 = NULL;
  if (!arkAllocVec(ark_mem, ark_mem->tempv1, &(pdata->tmp2)))
  {
    SUNLinSolFree(pdata->LS);
    SUNMatDestroy(pdata->savedP);
    SUNMatDestroy(pdata->savedJ);
    arkFreeVec(ark_mem, &(pdata->tmp1));
    free(pdata);
    pdata = NULL;
    arkProcessError(ark_mem, ARKLS_MEM_FAIL, __LINE__, __func__, __FILE__,
                    MSG_BP_MEM_FAIL);
    return (ARKLS_MEM_FAIL);
  }

  /* initialize band linear solver object */
  retval = SUNLinSolInitialize(pdata->LS);
  if (retval != SUN_SUCCESS)
  {
    SUNLinSolFree(pdata->LS);
    SUNMatDestroy(pdata->savedP);
    SUNMatDestroy(pdata->savedJ);
    arkFreeVec(ark_mem, &(pdata->tmp1));
    arkFreeVec(ark_mem, &(pdata->tmp2));
    free(pdata);
    pdata = NULL;
    arkProcessError(ark_mem, ARKLS_SUNLS_FAIL, __LINE__, __func__, __FILE__,
                    MSG_BP_SUNLS_FAIL);
    return (ARKLS_SUNLS_FAIL);
  }

  /* make sure s_P_data is free from any previous allocations */
  if (arkls_mem->pfree) { arkls_mem->pfree(ark_mem); }

  /* Point to the new P_data field in the LS memory */
  arkls_mem->P_data = pdata;

  /* Attach the pfree function */
  arkls_mem->pfree = ARKBandPrecFree;

  /* Attach preconditioner solve and setup functions */
  retval = ARKodeSetPreconditioner(arkode_mem, ARKBandPrecSetup,
                                   ARKBandPrecSolve);
  return (retval);
}